

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtFace>::resize
          (cbtAlignedObjectArray<cbtFace> *this,int newsize,cbtFace *fillData)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = this->m_size;
  lVar2 = (long)iVar1;
  if (newsize < iVar1) {
    lVar4 = (long)newsize;
    lVar3 = lVar4 * 0x30;
    for (; lVar4 < lVar2; lVar4 = lVar4 + 1) {
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar3 + -0x20));
      lVar3 = lVar3 + 0x30;
    }
  }
  else {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    lVar3 = lVar2 * 0x30;
    for (; lVar2 < newsize; lVar2 = lVar2 + 1) {
      cbtFace::cbtFace((cbtFace *)((long)this->m_data->m_plane + lVar3 + -0x20),fillData);
      lVar3 = lVar3 + 0x30;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}